

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::ArgMinFun::GetFunctions(void)

{
  aggregate_size_t *pp_Var1;
  AggregateFunctionSet *in_RDI;
  undefined8 *puVar2;
  LogicalType *by_type;
  LogicalType *by_type_00;
  long lVar3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> by_types;
  allocator_type local_2c9;
  LogicalType local_2c8;
  LogicalType local_2b0;
  vector<duckdb::LogicalType,_true> local_298;
  AggregateFunction local_280;
  undefined1 local_150 [48];
  LogicalType local_120 [4];
  LogicalType local_c0;
  FunctionStability local_a8;
  FunctionNullHandling FStack_a7;
  FunctionErrors FStack_a6;
  FunctionCollationHandling FStack_a5;
  undefined8 auStack_a0 [14];
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  bVar4 = 0;
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&local_280,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,int>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,long>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,double>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::date_t>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType((LogicalType *)&local_280,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  ArgMaxByTypes();
  for (by_type_00 = (LogicalType *)
                    local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function;
      by_type_00 !=
      (LogicalType *)
      local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p;
      by_type_00 = by_type_00 + 1) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,true>>(in_RDI,by_type_00);
  }
  LogicalType::LogicalType((LogicalType *)local_150,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,(LogicalType *)local_150);
  LogicalType::~LogicalType((LogicalType *)local_150);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
            (in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_280);
  LogicalType::LogicalType((LogicalType *)local_150,ANY);
  LogicalType::LogicalType((LogicalType *)(local_150 + 0x18),ANY);
  LogicalType::LogicalType(local_120,BIGINT);
  __l._M_len = 3;
  __l._M_array = (iterator)local_150;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_298,__l,
             &local_2c9);
  LogicalType::LogicalType(&local_2c8,ANY);
  LogicalType::LIST(&local_2b0,&local_2c8);
  AggregateFunction::AggregateFunction
            (&local_280,&local_298,&local_2b0,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,
             (aggregate_update_t)0x0,(aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,
             (aggregate_simple_update_t)0x0,ArgMinMaxNBind<duckdb::LessThan>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_2b0);
  LogicalType::~LogicalType(&local_2c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_298);
  lVar3 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_150 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_150,(SimpleFunction *)&local_280);
  local_150._0_8_ = &PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_c0,&local_280.super_BaseScalarFunction.return_type);
  local_a8 = local_280.super_BaseScalarFunction.stability;
  FStack_a7 = local_280.super_BaseScalarFunction.null_handling;
  FStack_a6 = local_280.super_BaseScalarFunction.errors;
  FStack_a5 = local_280.super_BaseScalarFunction.collation_handling;
  local_150._0_8_ = &PTR__AggregateFunction_0243cea8;
  pp_Var1 = &local_280.state_size;
  puVar2 = auStack_a0;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar2 = *pp_Var1;
    pp_Var1 = pp_Var1 + (ulong)bVar4 * -2 + 1;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
  }
  auStack_a0[0xd]._0_1_ = local_280.order_dependent;
  auStack_a0[0xd]._1_1_ = local_280.distinct_dependent;
  local_30 = local_280.function_info.internal.
             super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28._M_pi =
       local_280.function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_280.function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_280.function_info.internal.
            super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_280.function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_280.function_info.internal.
            super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             (AggregateFunction *)local_150);
  local_150._0_8_ = &PTR__AggregateFunction_0243cea8;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_150);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243cea8;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMinFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<LessThan, true, OrderType::ASCENDING>(fun);
	AddArgMinMaxNFunction<LessThan>(fun);
	return fun;
}